

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::ValidBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  ulong r;
  bool bVar4;
  reference pvVar5;
  WindowCursor *this_00;
  ulong uVar6;
  idx_t chunk_idx;
  idx_t iVar7;
  idx_t n;
  optional_ptr<duckdb::WindowCursor,_true> range_local;
  
  range_local = range;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,0);
  pdVar1 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,1);
  pdVar2 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,4);
  pdVar3 = pvVar5->data;
  for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
    if (((partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
         [row_idx + iVar7 >> 6] >> (row_idx + iVar7 & 0x3f) & 1) == 0 && !is_jump) {
      uVar6 = this->valid_start;
    }
    else {
      uVar6 = *(ulong *)(pdVar1 + iVar7 * 8);
      this->valid_start = uVar6;
      r = *(ulong *)(pdVar2 + iVar7 * 8);
      if ((uVar6 < r) && (this->has_preceding_range == true)) {
        this_00 = optional_ptr<duckdb::WindowCursor,_true>::operator->(&range_local);
        bVar4 = WindowCursor::CellIsNull(this_00,0,this->valid_start);
        uVar6 = this->valid_start;
        if (bVar4) {
          n = 1;
          uVar6 = FindNextStart(order_mask,uVar6 + 1,r,&n);
          this->valid_start = uVar6;
        }
      }
    }
    *(ulong *)(pdVar3 + iVar7 * 8) = uVar6;
  }
  return;
}

Assistant:

void WindowBoundariesState::ValidBegin(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                       const ValidityMask &partition_mask, const ValidityMask &order_mask,
                                       optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_END]);
	auto valid_begin_data = FlatVector::GetData<idx_t>(bounds.data[VALID_BEGIN]);

	//	OVER()
	D_ASSERT(partition_count + order_count != 0);
	D_ASSERT(range);

	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);

		if (!is_same_partition || is_jump) {
			// Find valid ordering values for the new partition
			// so we can exclude NULLs from RANGE expression computations
			valid_start = partition_begin_data[chunk_idx];
			const auto valid_end = partition_end_data[chunk_idx];

			if ((valid_start < valid_end) && has_preceding_range) {
				// Exclude any leading NULLs
				if (range->CellIsNull(0, valid_start)) {
					idx_t n = 1;
					valid_start = FindNextStart(order_mask, valid_start + 1, valid_end, n);
				}
			}
		}

		valid_begin_data[chunk_idx] = valid_start;
	}
}